

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.hpp
# Opt level: O0

void __thiscall duckdb::TableRef::~TableRef(TableRef *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TableRef_034f0e80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x24750a);
  shared_ptr<duckdb::ExternalDependency,_true>::~shared_ptr
            ((shared_ptr<duckdb::ExternalDependency,_true> *)0x247518);
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             0x247526);
  ::std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

virtual ~TableRef() {
	}